

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeHalt(Vdbe *p)

{
  i64 *piVar1;
  ushort uVar2;
  sqlite3 *db;
  VdbeFrame *pVVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  VdbeFrame *pFrame;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  VdbeFrame *pDel;
  
  db = p->db;
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  pVVar3 = p->pFrame;
  if (p->pFrame != (VdbeFrame *)0x0) {
    do {
      pFrame = pVVar3;
      pVVar3 = pFrame->pParent;
    } while (pVVar3 != (VdbeFrame *)0x0);
    sqlite3VdbeFrameRestore(pFrame);
    p->pFrame = (VdbeFrame *)0x0;
    p->nFrame = 0;
  }
  closeCursorsInFrame(p);
  if (p->aMem != (Mem *)0x0) {
    releaseMemArray(p->aMem,p->nMem);
  }
  while (pVVar3 = p->pDelFrame, pVVar3 != (VdbeFrame *)0x0) {
    p->pDelFrame = pVVar3->pParent;
    iVar10 = pVVar3->nChildMem;
    if (0 < pVVar3->nChildCsr) {
      lVar11 = 0;
      do {
        sqlite3VdbeFreeCursor(pVVar3->v,(VdbeCursor *)(&pVVar3[1].v)[(long)iVar10 * 7 + lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar3->nChildCsr);
      iVar10 = pVVar3->nChildMem;
    }
    releaseMemArray((Mem *)(pVVar3 + 1),iVar10);
    sqlite3VdbeDeleteAuxData(pVVar3->v->db,&pVVar3->pAuxData,-1,0);
    sqlite3DbFree(pVVar3->v->db,pVVar3);
  }
  if (p->pAuxData != (AuxData *)0x0) {
    sqlite3VdbeDeleteAuxData(p->db,&p->pAuxData,-1,0);
  }
  iVar10 = 0;
  if (p->magic != 0x2df20da3) {
    return 0;
  }
  if (p->pc < 0) goto LAB_0012afc7;
  if ((p->field_0xc1 & 1) != 0) {
    sqlite3VdbeEnter(p);
    uVar7 = p->rc;
    bVar5 = false;
    bVar4 = true;
    bVar6 = (byte)uVar7;
    if ((bVar6 < 0xe) && ((0x2680U >> (uVar7 & 0x1f) & 1) != 0)) {
      if (bVar6 != 9 || -1 < (char)*(ushort *)&p->field_0xc0) {
        if (((bVar6 == 0xd) || ((uVar7 & 0xff) == 7)) && ((*(ushort *)&p->field_0xc0 & 0x40) != 0))
        {
          iVar12 = 2;
          bVar5 = true;
          bVar4 = false;
        }
        else {
          sqlite3RollbackAll(db,0x204);
          sqlite3CloseSavepoints(db);
          db->autoCommit = '\x01';
          p->nChange = 0;
          uVar7 = p->rc;
          iVar12 = 0;
          bVar5 = true;
          bVar4 = true;
        }
        goto LAB_0012ad38;
      }
      bVar4 = true;
      iVar12 = 0;
      bVar5 = true;
    }
    else {
      iVar12 = 0;
LAB_0012ad38:
      if ((uVar7 == 0) && (0 < p->nFkConstraint)) {
        p->rc = 0x313;
        p->errorAction = '\x02';
        sqlite3VdbeError(p,"FOREIGN KEY constraint failed");
      }
    }
    if (((db->nVTrans < 1) || (db->aVTrans != (VTable **)0x0)) &&
       ((db->autoCommit != '\0' && (db->nVdbeWrite == (uint)((p->field_0xc0 & 0x80) == 0))))) {
      if ((p->rc == 0) || (!bVar5 && p->errorAction == '\x03')) {
        lVar11 = p->db->nDeferredImmCons;
        piVar1 = &p->db->nDeferredCons;
        lVar9 = lVar11 + *piVar1;
        if (lVar9 != 0 && SCARRY8(lVar11,*piVar1) == lVar9 < 0) {
          p->rc = 0x313;
          p->errorAction = '\x02';
          sqlite3VdbeError(p,"FOREIGN KEY constraint failed");
          iVar8 = 0x313;
          if ((p->field_0xc0 & 0x80) != 0) {
            iVar10 = 1;
LAB_0012ae04:
            if (p->lockMask == 0) {
              return iVar10;
            }
            vdbeLeave(p);
            return iVar10;
          }
LAB_0012aeb6:
          p->rc = iVar8;
          goto LAB_0012aeb9;
        }
        iVar8 = vdbeCommit(db,p);
        if (iVar8 != 0) {
          if ((iVar8 == 5) && (iVar8 = 5, (p->field_0xc0 & 0x80) != 0)) {
            iVar10 = 5;
            goto LAB_0012ae04;
          }
          goto LAB_0012aeb6;
        }
        db->nDeferredCons = 0;
        db->nDeferredImmCons = 0;
        db->flags = db->flags & 0xfdfffffd;
      }
      else {
LAB_0012aeb9:
        sqlite3RollbackAll(db,0);
        p->nChange = 0;
      }
      db->nStatement = 0;
LAB_0012aed5:
      if (iVar12 == 0) {
        if ((p->field_0xc0 & 0x10) != 0) {
LAB_0012af71:
          iVar12 = p->nChange;
          goto LAB_0012af74;
        }
      }
      else {
LAB_0012aede:
        if (((p->db->nStatement != 0) && (p->iStatement != 0)) &&
           (iVar8 = vdbeCloseStatement(p,iVar12), iVar8 != 0)) {
          if (p->rc == 0 || (char)p->rc == '\x13') {
            p->rc = iVar8;
            sqlite3DbFree(db,p->zErrMsg);
            p->zErrMsg = (char *)0x0;
          }
          sqlite3RollbackAll(db,0x204);
          sqlite3CloseSavepoints(db);
          db->autoCommit = '\x01';
          p->nChange = 0;
        }
        if ((p->field_0xc0 & 0x10) != 0) {
          if (iVar12 != 2) goto LAB_0012af71;
          db->nChange = 0;
          goto LAB_0012af7c;
        }
      }
    }
    else {
      if (!bVar4) goto LAB_0012aed5;
      iVar12 = 1;
      if ((p->rc == 0) || (p->errorAction == '\x03')) goto LAB_0012aede;
      if (p->errorAction == '\x02') {
        iVar12 = 2;
        goto LAB_0012aede;
      }
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
      db->autoCommit = '\x01';
      p->nChange = 0;
      iVar12 = 0;
      if ((p->field_0xc0 & 0x10) == 0) goto LAB_0012af83;
LAB_0012af74:
      db->nChange = iVar12;
      db->nTotalChange = db->nTotalChange + iVar12;
LAB_0012af7c:
      p->nChange = 0;
    }
LAB_0012af83:
    if (p->lockMask != 0) {
      vdbeLeave(p);
    }
  }
  if (-1 < p->pc) {
    db->nVdbeActive = db->nVdbeActive + -1;
    uVar2 = *(ushort *)&p->field_0xc0;
    if (-1 < (char)uVar2) {
      db->nVdbeWrite = db->nVdbeWrite + -1;
      uVar2 = *(ushort *)&p->field_0xc0;
    }
    if ((uVar2 >> 8 & 1) != 0) {
      db->nVdbeRead = db->nVdbeRead + -1;
    }
  }
LAB_0012afc7:
  p->magic = 0x319c2973;
  if (db->mallocFailed == '\0') {
    iVar10 = (uint)(p->rc == 5) * 5;
  }
  else {
    p->rc = 7;
  }
  return iVar10;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine. 
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }
  closeAllCursors(p);
  if( p->magic!=VDBE_MAGIC_RUN ){
    return SQLITE_OK;
  }
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started or if the
  ** SQL statement does not read or write a database file.  */
  if( p->pc>=0 && p->bIsReader ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    mrc = p->rc & 0xff;
    isSpecialError = mrc==SQLITE_NOMEM || mrc==SQLITE_IOERR
                     || mrc==SQLITE_INTERRUPT || mrc==SQLITE_FULL;
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT, 
      ** no rollback is necessary. Otherwise, at least a savepoint 
      ** transaction must be rolled back to restore the database to a 
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error 
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore 
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
          p->nChange = 0;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK ){
      sqlite3VdbeCheckFk(p, 0);
    }
  
    /* If the auto-commit flag is set and this is the only active writer 
    ** VM, then we do either a commit or rollback of the current transaction. 
    **
    ** Note: This block also runs if one of the special errors handled 
    ** above has occurred. 
    */
    if( !sqlite3VtabInSync(db) 
     && db->autoCommit 
     && db->nVdbeWrite==(p->readOnly==0) 
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else{ 
          /* The auto-commit flag is true, the vdbe program was successful 
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit 
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
          p->nChange = 0;
        }else{
          db->nDeferredCons = 0;
          db->nDeferredImmCons = 0;
          db->flags &= ~SQLITE_DeferFKs;
          sqlite3CommitInternalChanges(db);
        }
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
        p->nChange = 0;
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }
  
    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }
  
    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter. 
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  if( p->pc>=0 ){
    db->nVdbeActive--;
    if( !p->readOnly ) db->nVdbeWrite--;
    if( p->bIsReader ) db->nVdbeRead--;
    assert( db->nVdbeActive>=db->nVdbeRead );
    assert( db->nVdbeRead>=db->nVdbeWrite );
    assert( db->nVdbeWrite>=0 );
  }
  p->magic = VDBE_MAGIC_HALT;
  checkActiveVdbeCnt(db);
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked() 
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->nVdbeActive>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}